

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
inject::circular_dependency::circular_dependency(circular_dependency *this,unique_id component)

{
  ostream *this_00;
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream oss;
  ostream local_190 [376];
  unique_id local_18;
  unique_id component_local;
  circular_dependency *this_local;
  
  local_18 = component;
  component_local = (unique_id)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__circular_dependency_00126a68;
  this->_component = local_18;
  std::__cxx11::string::string((string *)&this->_msg);
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"circular dependency detected in component ");
  std::ostream::operator<<(this_00,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

circular_dependency(unique_id component) throw() :
            exception(), _component(component) {
        std::stringstream oss;
        oss << "circular dependency detected in component " << component;
        _msg = oss.str();
    }